

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  mat44 R;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  nifti_image *pnVar5;
  nifti_image *pnVar6;
  nifti_image *nim;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  undefined **ppuVar10;
  float (*__s) [4];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  float qfac;
  float dz;
  float dy;
  float dx;
  float qz;
  float qy;
  float qx;
  nifti_brick_list NB_orig;
  int blist [5];
  char write_image_filename [6] [64];
  nifti_brick_list NB_select;
  char TEMP_STR [256];
  uint local_764;
  byte local_75d;
  float local_75c;
  float local_758;
  float local_754;
  long local_750;
  float local_748;
  float local_744;
  float local_740;
  float local_73c;
  mat44 local_738 [8];
  float local_538 [8];
  znzFile local_518 [8];
  char local_4d8 [128];
  char local_458 [64];
  char local_418 [128];
  nifti_1_header local_398;
  char local_238 [520];
  
  nifti_set_debug_level(3);
  printf("%s%s (LINE %d): %s\n","==========ERROR","",0xa5,
         "NOT REALLY AN ERROR, JUST TESTING THE ERROR TEST REPORTING MECHANISM");
  fflush(_stdout);
  local_764 = 1;
  _PrintTest(0xa6,"NOT REALLY AN ERROR, JUST TESTING THE ERROR COUNTING MECHANISM",1,NIFTITEST_FALSE
             ,(int *)&local_764);
  local_764 = 0;
  memcpy(local_518,"ATestReferenceImageForReadingAndWriting.nii",0x180);
  puts("======= Testing All Nifti Valid Names ======");
  fflush(_stdout);
  lVar7 = 0;
  do {
    pcVar8 = (char *)((long)local_518 + lVar7);
    local_750 = lVar7;
    pcVar4 = strstr(pcVar8,".img.gz");
    bVar1 = true;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strstr(pcVar8,".hdr.gz");
      bVar1 = pcVar4 != (char *)0x0;
    }
    local_75d = bVar1;
    printf("======= Testing with filename: %s ======\n",pcVar8);
    fflush(_stdout);
    pnVar5 = generate_reference_image(pcVar8,(int *)&local_764);
    sprintf(local_238,"nifti_add_extension %s",pcVar8);
    iVar2 = nifti_add_extension(pnVar5,main::ext,0xf,6);
    _PrintTest(200,local_238,(uint)(iVar2 == -1),NIFTITEST_FALSE,(int *)&local_764);
    sprintf(local_238,"valid_nifti_extension %s",pcVar8);
    iVar2 = valid_nifti_extensions(pnVar5);
    _PrintTest(0xcc,"valid_nifti_extensions",(uint)(iVar2 == 0),NIFTITEST_FALSE,(int *)&local_764);
    _PrintTest(0xce,"Create reference image",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_TRUE,
               (int *)&local_764);
    nifti_image_write(pnVar5);
    pnVar6 = nifti_simple_init_nim();
    iVar2 = nifti_copy_extensions(pnVar6,pnVar5);
    _PrintTest(0xd7,"nifti_copy_extension",iVar2,NIFTITEST_FALSE,(int *)&local_764);
    nifti_image_free(pnVar6);
    pnVar6 = nifti_copy_nim_info(pnVar5);
    _PrintTest(0xdd,"nifti_copy_nim_info",(uint)(pnVar6 == (nifti_image *)0x0),NIFTITEST_FALSE,
               (int *)&local_764);
    iVar2 = nifti_nim_is_valid(pnVar6,0);
    _PrintTest(0xe0,"nifti_nim_is_valid",(uint)(iVar2 == 0),NIFTITEST_FALSE,(int *)&local_764);
    nifti_image_free(pnVar6);
    pnVar6 = nifti_image_read(pnVar5->fname,1);
    _PrintTest(0xe8,"Reload of image ",(uint)(pnVar6 == (nifti_image *)0x0),NIFTITEST_TRUE,
               (int *)&local_764);
    iVar2 = valid_nifti_extensions(pnVar6);
    sprintf(local_238,"reload valid_nifti_extensions %s",pcVar8);
    _PrintTest(0xf5,local_238,(uint)(iVar2 == 0 ^ local_75d),NIFTITEST_FALSE,(int *)&local_764);
    nifti_image_infodump(pnVar6);
    compare_reference_image_values(pnVar5,pnVar6,(int *)&local_764);
    nifti_image_free(pnVar6);
    local_538[0] = 9.80909e-45;
    local_538[1] = 0.0;
    local_538[2] = 7.00649e-45;
    local_538[3] = 7.00649e-45;
    local_538[4] = 1.26117e-44;
    pnVar6 = nifti_image_read_bricks(pnVar5->fname,0,(int *)local_538,(nifti_brick_list *)local_738)
    ;
    _PrintTest(0x107,"invalid arg bricked image read 1",(uint)(pnVar6 != (nifti_image *)0x0),
               NIFTITEST_FALSE,(int *)&local_764);
    pnVar6 = nifti_image_read_bricks(pnVar5->fname,0,(int *)0x0,(nifti_brick_list *)local_738);
    _PrintTest(0x10a,"Reload of bricked image",(uint)(pnVar6 == (nifti_image *)0x0),NIFTITEST_FALSE,
               (int *)&local_764);
    nifti_free_NBL((nifti_brick_list *)local_738);
    nifti_image_free(pnVar6);
    nim = nifti_image_read_bricks(pnVar5->fname,5,(int *)local_538,(nifti_brick_list *)&local_398);
    _PrintTest(0x10f,"Reload of bricked image with blist",(uint)(pnVar6 == (nifti_image *)0x0),
               NIFTITEST_FALSE,(int *)&local_764);
    nifti_free_NBL((nifti_brick_list *)&local_398);
    nifti_image_free(nim);
    iVar2 = nifti_update_dims_from_array(pnVar5);
    _PrintTest(0x119,"nifti_update_dims_from_array -- valid dims",(uint)(iVar2 != 0),NIFTITEST_FALSE
               ,(int *)&local_764);
    pnVar5->dim[0] = 8;
    iVar2 = nifti_update_dims_from_array(pnVar5);
    _PrintTest(0x11d,"nifti_update_dims_from_array -- invalid dims",(uint)(iVar2 == 0),
               NIFTITEST_FALSE,(int *)&local_764);
    nifti_convert_nim2nhdr(&local_398,pnVar5);
    sprintf((char *)local_738,"nifti_hdr_looks_good %s",pnVar5->fname);
    iVar2 = nifti_hdr_looks_good(&local_398);
    _PrintTest(0x124,(char *)local_738,(uint)(iVar2 == 0),NIFTITEST_FALSE,(int *)&local_764);
    nifti_image_free(pnVar5);
    lVar7 = local_750 + 0x40;
  } while (lVar7 != 0x180);
  pcVar4 = nifti_findimgname("ATestReferenceImageForReadingAndWriting.hdr",2);
  if (pcVar4 == (char *)0x0) {
    uVar3 = 1;
  }
  else {
    iVar2 = strcmp(pcVar4,"ATestReferenceImageForReadingAndWriting.img");
    uVar3 = (uint)(iVar2 != 0);
  }
  _PrintTest(0x131,"nifti_findimgname",uVar3,NIFTITEST_FALSE,(int *)&local_764);
  free(pcVar4);
  iVar2 = is_nifti_file((char *)local_518);
  _PrintTest(0x138,"is_nifti_file0",(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  iVar2 = is_nifti_file(local_4d8);
  _PrintTest(0x13b,"is_nifti_file1",(uint)(iVar2 != 2),NIFTITEST_FALSE,(int *)&local_764);
  iVar2 = is_nifti_file(local_458);
  _PrintTest(0x13e,"is_nifti_file2",(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  iVar2 = is_nifti_file(local_418);
  _PrintTest(0x141,"is_nifti_file2",(uint)(iVar2 != 2),NIFTITEST_FALSE,(int *)&local_764);
  pnVar5 = generate_reference_image("TestAsciiImage.nia",(int *)&local_764);
  pnVar5->nifti_type = 3;
  nifti_image_write(pnVar5);
  pnVar6 = nifti_image_read("TestAsciiImage.nia",1);
  _PrintTest(0x14f,"Read/Write Ascii image",(uint)(pnVar6 == (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_764);
  nifti_image_free(pnVar5);
  nifti_image_free(pnVar6);
  ppuVar10 = &PTR_anon_var_dwarf_3855_00122900;
  lVar7 = 0;
  do {
    pcVar4 = *ppuVar10;
    printf("\nTesting \"%s\" filename\n",pcVar4);
    uVar3 = nifti_validfilename(pcVar4);
    snprintf(local_238,0x100,"nifti_validfilename(\"%s\")=%d",pcVar4,(ulong)uVar3);
    _PrintTest(0x185,local_238,(uint)(uVar3 != *(uint *)((long)&DAT_00116eb0 + lVar7)),
               NIFTITEST_FALSE,(int *)&local_764);
    uVar3 = nifti_is_complete_filename(pcVar4);
    snprintf(local_238,0x100,"nifti_is_complete_filename(\"%s\")=%d",pcVar4,(ulong)uVar3);
    _PrintTest(0x18a,local_238,(uint)(uVar3 != *(uint *)((long)&DAT_00116ed0 + lVar7)),
               NIFTITEST_FALSE,(int *)&local_764);
    pcVar8 = nifti_makebasename(pcVar4);
    snprintf(local_238,0x100,"nifti_makebasename(\"%s\")=\"%s\"",pcVar4,pcVar8);
    iVar2 = strcmp(pcVar8,(char *)((long)&DAT_00116e84 + (long)*(int *)((long)&DAT_00116e84 + lVar7)
                                  ));
    _PrintTest(400,local_238,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
    free(pcVar8);
    lVar7 = lVar7 + 4;
    ppuVar10 = ppuVar10 + 1;
  } while (lVar7 != 0x20);
  nifti_disp_lib_hist();
  nifti_disp_lib_version();
  pnVar5 = nifti_image_read_bricks((char *)0x0,-1,(int *)0x0,(nifti_brick_list *)0x0);
  _PrintTest(0x1a2,"nifti_image_read_bricks 1",(uint)(pnVar5 != (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_764);
  pnVar5 = nifti_image_read_bricks("NOFILE.NOFILE",-1,(int *)0x0,(nifti_brick_list *)0x0);
  _PrintTest(0x1a7,"nifti_image_read_bricks 1",(uint)(pnVar5 != (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","UNKNOWN");
  pcVar4 = nifti_datatype_string(0);
  iVar2 = strcmp(pcVar4,"UNKNOWN");
  _PrintTest(0x1b6,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","BINARY");
  uVar9 = 1;
  pcVar4 = nifti_datatype_string(1);
  iVar2 = strcmp(pcVar4,"BINARY");
  _PrintTest(0x1b7,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT8");
  pcVar4 = nifti_datatype_string(0x100);
  iVar2 = strcmp(pcVar4,"INT8");
  _PrintTest(0x1b8,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT8");
  pcVar4 = nifti_datatype_string(2);
  iVar2 = strcmp(pcVar4,"UINT8");
  _PrintTest(0x1b9,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT16");
  pcVar4 = nifti_datatype_string(4);
  iVar2 = strcmp(pcVar4,"INT16");
  _PrintTest(0x1ba,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT16");
  pcVar4 = nifti_datatype_string(0x200);
  iVar2 = strcmp(pcVar4,"UINT16");
  _PrintTest(0x1bb,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT32");
  pcVar4 = nifti_datatype_string(8);
  iVar2 = strcmp(pcVar4,"INT32");
  _PrintTest(0x1bc,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT32");
  pcVar4 = nifti_datatype_string(0x300);
  iVar2 = strcmp(pcVar4,"UINT32");
  _PrintTest(0x1bd,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","INT64");
  pcVar4 = nifti_datatype_string(0x400);
  iVar2 = strcmp(pcVar4,"INT64");
  _PrintTest(0x1be,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","UINT64");
  pcVar4 = nifti_datatype_string(0x500);
  iVar2 = strcmp(pcVar4,"UINT64");
  _PrintTest(0x1bf,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","FLOAT32");
  pcVar4 = nifti_datatype_string(0x10);
  iVar2 = strcmp(pcVar4,"FLOAT32");
  _PrintTest(0x1c0,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","FLOAT64");
  pcVar4 = nifti_datatype_string(0x40);
  iVar2 = strcmp(pcVar4,"FLOAT64");
  _PrintTest(0x1c1,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","FLOAT128");
  pcVar4 = nifti_datatype_string(0x600);
  iVar2 = strcmp(pcVar4,"FLOAT128");
  _PrintTest(0x1c2,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","COMPLEX64");
  pcVar4 = nifti_datatype_string(0x20);
  iVar2 = strcmp(pcVar4,"COMPLEX64");
  _PrintTest(0x1c3,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","COMPLEX128");
  pcVar4 = nifti_datatype_string(0x700);
  iVar2 = strcmp(pcVar4,"COMPLEX128");
  _PrintTest(0x1c4,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","COMPLEX256");
  pcVar4 = nifti_datatype_string(0x800);
  iVar2 = strcmp(pcVar4,"COMPLEX256");
  _PrintTest(0x1c5,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %s","RGB24");
  pcVar4 = nifti_datatype_string(0x80);
  iVar2 = strcmp(pcVar4,"RGB24");
  _PrintTest(0x1c6,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0);
  iVar2 = nifti_is_inttype(0);
  _PrintTest(0x1d1,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",1);
  iVar2 = nifti_is_inttype(1);
  _PrintTest(0x1d2,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x100);
  iVar2 = nifti_is_inttype(0x100);
  _PrintTest(0x1d3,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",2);
  iVar2 = nifti_is_inttype(2);
  _PrintTest(0x1d4,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",4);
  iVar2 = nifti_is_inttype(4);
  _PrintTest(0x1d5,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x200);
  iVar2 = nifti_is_inttype(0x200);
  _PrintTest(0x1d6,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",8);
  iVar2 = nifti_is_inttype(8);
  _PrintTest(0x1d7,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x300);
  iVar2 = nifti_is_inttype(0x300);
  _PrintTest(0x1d8,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x400);
  iVar2 = nifti_is_inttype(0x400);
  _PrintTest(0x1d9,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x500);
  iVar2 = nifti_is_inttype(0x500);
  _PrintTest(0x1da,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x10);
  iVar2 = nifti_is_inttype(0x10);
  _PrintTest(0x1db,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x40);
  iVar2 = nifti_is_inttype(0x40);
  _PrintTest(0x1dc,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x600);
  iVar2 = nifti_is_inttype(0x600);
  _PrintTest(0x1dd,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x20);
  iVar2 = nifti_is_inttype(0x20);
  _PrintTest(0x1de,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x700);
  iVar2 = nifti_is_inttype(0x700);
  _PrintTest(0x1df,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x800);
  iVar2 = nifti_is_inttype(0x800);
  _PrintTest(0x1e0,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_string %d",0x80);
  iVar2 = nifti_is_inttype(0x80);
  _PrintTest(0x1e1,(char *)local_738,(uint)(iVar2 != 1),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","m");
  pcVar4 = nifti_units_string(1);
  uVar3 = 1;
  if (*pcVar4 == 'm') {
    uVar3 = (uint)(pcVar4[1] != '\0');
  }
  _PrintTest(0x1ec,(char *)local_738,uVar3,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","mm");
  pcVar4 = nifti_units_string(2);
  if ((*pcVar4 == 'm') && (pcVar4[1] == 'm')) {
    uVar9 = (uint)(pcVar4[2] != '\0');
  }
  _PrintTest(0x1ed,(char *)local_738,uVar9,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","um");
  pcVar4 = nifti_units_string(3);
  uVar9 = 1;
  uVar3 = 1;
  if ((*pcVar4 == 'u') && (pcVar4[1] == 'm')) {
    uVar3 = (uint)(pcVar4[2] != '\0');
  }
  _PrintTest(0x1ee,(char *)local_738,uVar3,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","s");
  pcVar4 = nifti_units_string(8);
  if (*pcVar4 == 's') {
    uVar9 = (uint)(pcVar4[1] != '\0');
  }
  _PrintTest(0x1ef,(char *)local_738,uVar9,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","ms");
  pcVar4 = nifti_units_string(0x10);
  uVar9 = 1;
  uVar3 = 1;
  if ((*pcVar4 == 'm') && (pcVar4[1] == 's')) {
    uVar3 = (uint)(pcVar4[2] != '\0');
  }
  _PrintTest(0x1f0,(char *)local_738,uVar3,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","us");
  pcVar4 = nifti_units_string(0x18);
  if ((*pcVar4 == 'u') && (pcVar4[1] == 's')) {
    uVar9 = (uint)(pcVar4[2] != '\0');
  }
  _PrintTest(0x1f1,(char *)local_738,uVar9,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","Hz");
  pcVar4 = nifti_units_string(0x20);
  uVar3 = 1;
  if ((*pcVar4 == 'H') && (pcVar4[1] == 'z')) {
    uVar3 = (uint)(pcVar4[2] != '\0');
  }
  lVar7 = 0;
  _PrintTest(0x1f2,(char *)local_738,uVar3,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","ppm");
  pcVar4 = nifti_units_string(0x28);
  iVar2 = strcmp(pcVar4,"ppm");
  _PrintTest(499,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_units_string_test %s","rad/s");
  pcVar4 = nifti_units_string(0x30);
  iVar2 = strcmp(pcVar4,"rad/s");
  _PrintTest(500,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Correlation statistic");
  pcVar4 = nifti_intent_string(2);
  iVar2 = strcmp(pcVar4,"Correlation statistic");
  _PrintTest(0x1ff,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","T-statistic");
  pcVar4 = nifti_intent_string(3);
  iVar2 = strcmp(pcVar4,"T-statistic");
  _PrintTest(0x200,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","F-statistic");
  pcVar4 = nifti_intent_string(4);
  iVar2 = strcmp(pcVar4,"F-statistic");
  _PrintTest(0x201,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Z-score");
  pcVar4 = nifti_intent_string(5);
  iVar2 = strcmp(pcVar4,"Z-score");
  _PrintTest(0x202,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Chi-squared distribution");
  pcVar4 = nifti_intent_string(6);
  iVar2 = strcmp(pcVar4,"Chi-squared distribution");
  _PrintTest(0x203,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Beta distribution");
  pcVar4 = nifti_intent_string(7);
  iVar2 = strcmp(pcVar4,"Beta distribution");
  _PrintTest(0x204,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Binomial distribution");
  pcVar4 = nifti_intent_string(8);
  iVar2 = strcmp(pcVar4,"Binomial distribution");
  _PrintTest(0x205,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Gamma distribution");
  pcVar4 = nifti_intent_string(9);
  iVar2 = strcmp(pcVar4,"Gamma distribution");
  _PrintTest(0x206,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Poisson distribution");
  pcVar4 = nifti_intent_string(10);
  iVar2 = strcmp(pcVar4,"Poisson distribution");
  _PrintTest(0x207,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Normal distribution");
  pcVar4 = nifti_intent_string(0xb);
  iVar2 = strcmp(pcVar4,"Normal distribution");
  _PrintTest(0x208,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","F-statistic noncentral");
  pcVar4 = nifti_intent_string(0xc);
  iVar2 = strcmp(pcVar4,"F-statistic noncentral");
  _PrintTest(0x209,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Chi-squared noncentral");
  pcVar4 = nifti_intent_string(0xd);
  iVar2 = strcmp(pcVar4,"Chi-squared noncentral");
  _PrintTest(0x20a,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Logistic distribution");
  pcVar4 = nifti_intent_string(0xe);
  iVar2 = strcmp(pcVar4,"Logistic distribution");
  _PrintTest(0x20b,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Laplace distribution");
  pcVar4 = nifti_intent_string(0xf);
  iVar2 = strcmp(pcVar4,"Laplace distribution");
  _PrintTest(0x20c,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Uniform distribition");
  pcVar4 = nifti_intent_string(0x10);
  iVar2 = strcmp(pcVar4,"Uniform distribition");
  _PrintTest(0x20d,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","T-statistic noncentral");
  pcVar4 = nifti_intent_string(0x11);
  iVar2 = strcmp(pcVar4,"T-statistic noncentral");
  _PrintTest(0x20e,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Weibull distribution");
  pcVar4 = nifti_intent_string(0x12);
  iVar2 = strcmp(pcVar4,"Weibull distribution");
  _PrintTest(0x20f,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Chi distribution");
  pcVar4 = nifti_intent_string(0x13);
  iVar2 = strcmp(pcVar4,"Chi distribution");
  _PrintTest(0x210,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Inverse Gaussian distribution");
  pcVar4 = nifti_intent_string(0x14);
  iVar2 = strcmp(pcVar4,"Inverse Gaussian distribution");
  _PrintTest(0x211,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Extreme Value distribution");
  pcVar4 = nifti_intent_string(0x15);
  iVar2 = strcmp(pcVar4,"Extreme Value distribution");
  _PrintTest(0x212,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","P-value");
  pcVar4 = nifti_intent_string(0x16);
  iVar2 = strcmp(pcVar4,"P-value");
  _PrintTest(0x213,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Log P-value");
  pcVar4 = nifti_intent_string(0x17);
  iVar2 = strcmp(pcVar4,"Log P-value");
  _PrintTest(0x214,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Log10 P-value");
  pcVar4 = nifti_intent_string(0x18);
  iVar2 = strcmp(pcVar4,"Log10 P-value");
  _PrintTest(0x215,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Estimate");
  pcVar4 = nifti_intent_string(0x3e9);
  iVar2 = strcmp(pcVar4,"Estimate");
  _PrintTest(0x216,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Label index");
  pcVar4 = nifti_intent_string(0x3ea);
  iVar2 = strcmp(pcVar4,"Label index");
  _PrintTest(0x217,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","NeuroNames index");
  pcVar4 = nifti_intent_string(0x3eb);
  iVar2 = strcmp(pcVar4,"NeuroNames index");
  _PrintTest(0x218,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","General matrix");
  pcVar4 = nifti_intent_string(0x3ec);
  iVar2 = strcmp(pcVar4,"General matrix");
  _PrintTest(0x219,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Symmetric matrix");
  pcVar4 = nifti_intent_string(0x3ed);
  iVar2 = strcmp(pcVar4,"Symmetric matrix");
  _PrintTest(0x21a,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Displacement vector");
  pcVar4 = nifti_intent_string(0x3ee);
  iVar2 = strcmp(pcVar4,"Displacement vector");
  _PrintTest(0x21b,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Vector");
  pcVar4 = nifti_intent_string(0x3ef);
  iVar2 = strcmp(pcVar4,"Vector");
  _PrintTest(0x21c,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Pointset");
  pcVar4 = nifti_intent_string(0x3f0);
  iVar2 = strcmp(pcVar4,"Pointset");
  _PrintTest(0x21d,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Triangle");
  pcVar4 = nifti_intent_string(0x3f1);
  iVar2 = strcmp(pcVar4,"Triangle");
  _PrintTest(0x21e,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Quaternion");
  pcVar4 = nifti_intent_string(0x3f2);
  iVar2 = strcmp(pcVar4,"Quaternion");
  _PrintTest(0x21f,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Dimensionless number");
  pcVar4 = nifti_intent_string(0x3f3);
  iVar2 = strcmp(pcVar4,"Dimensionless number");
  _PrintTest(0x220,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_intent_string %s","Unknown");
  pcVar4 = nifti_intent_string(-200);
  iVar2 = strcmp(pcVar4,"Unknown");
  _PrintTest(0x221,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_slice_string_test %s","sequential_increasing");
  pcVar4 = nifti_slice_string(1);
  iVar2 = strcmp(pcVar4,"sequential_increasing");
  _PrintTest(0x22d,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_slice_string_test %s","sequential_decreasing");
  pcVar4 = nifti_slice_string(2);
  iVar2 = strcmp(pcVar4,"sequential_decreasing");
  _PrintTest(0x22e,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_increasing");
  pcVar4 = nifti_slice_string(3);
  iVar2 = strcmp(pcVar4,"alternating_increasing");
  _PrintTest(0x22f,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_decreasing");
  pcVar4 = nifti_slice_string(4);
  iVar2 = strcmp(pcVar4,"alternating_decreasing");
  _PrintTest(0x230,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_increasing_2");
  pcVar4 = nifti_slice_string(5);
  iVar2 = strcmp(pcVar4,"alternating_increasing_2");
  _PrintTest(0x231,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_slice_string_test %s","alternating_decreasing_2");
  pcVar4 = nifti_slice_string(6);
  iVar2 = strcmp(pcVar4,"alternating_decreasing_2");
  _PrintTest(0x232,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Left-to-Right");
  pcVar4 = nifti_orientation_string(1);
  iVar2 = strcmp(pcVar4,"Left-to-Right");
  _PrintTest(0x23d,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Right-to-Left");
  pcVar4 = nifti_orientation_string(2);
  iVar2 = strcmp(pcVar4,"Right-to-Left");
  _PrintTest(0x23e,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Posterior-to-Anterior");
  pcVar4 = nifti_orientation_string(3);
  iVar2 = strcmp(pcVar4,"Posterior-to-Anterior");
  _PrintTest(0x23f,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Anterior-to-Posterior");
  pcVar4 = nifti_orientation_string(4);
  iVar2 = strcmp(pcVar4,"Anterior-to-Posterior");
  _PrintTest(0x240,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Inferior-to-Superior");
  pcVar4 = nifti_orientation_string(5);
  iVar2 = strcmp(pcVar4,"Inferior-to-Superior");
  _PrintTest(0x241,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_orientation_string_test %s","Superior-to-Inferior");
  pcVar4 = nifti_orientation_string(6);
  iVar2 = strcmp(pcVar4,"Superior-to-Inferior");
  _PrintTest(0x242,(char *)local_738,(uint)(iVar2 != 0),NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",2);
  nifti_datatype_sizes(2,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x252,(char *)local_738,
             (uint)(local_518[0]._0_4_ != 1.4013e-45 || (float)local_398.sizeof_hdr != 0.0),
             NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x200);
  nifti_datatype_sizes(0x200,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x253,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 2.8026e-45 || local_518[0]._0_4_ != 2.8026e-45),
             NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x80);
  nifti_datatype_sizes(0x80,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x254,(char *)local_738,
             (uint)(local_518[0]._0_4_ != 4.2039e-45 || (float)local_398.sizeof_hdr != 0.0),
             NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x10);
  nifti_datatype_sizes(0x10,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x255,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 5.60519e-45 || local_518[0]._0_4_ != 5.60519e-45)
             ,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x20);
  nifti_datatype_sizes(0x20,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x256,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 5.60519e-45 || local_518[0]._0_4_ != 1.12104e-44)
             ,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x500);
  nifti_datatype_sizes(0x500,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(599,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 1.12104e-44 || local_518[0]._0_4_ != 1.12104e-44)
             ,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x600);
  nifti_datatype_sizes(0x600,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(600,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 2.24208e-44 || local_518[0]._0_4_ != 2.24208e-44)
             ,NIFTITEST_FALSE,(int *)&local_764);
  sprintf((char *)local_738,"nifti_datatype_sizes_test %d",0x700);
  nifti_datatype_sizes(0x700,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x259,(char *)local_738,
             (uint)((float)local_398.sizeof_hdr != 1.12104e-44 || local_518[0]._0_4_ != 2.24208e-44)
             ,NIFTITEST_FALSE,(int *)&local_764);
  __s = (float (*) [4])local_738;
  sprintf((char *)__s,"nifti_datatype_sizes_test %d",0x800);
  nifti_datatype_sizes(0x800,(int *)local_518,&local_398.sizeof_hdr);
  _PrintTest(0x25a,(char *)__s,
             (uint)((float)local_398.sizeof_hdr != 2.24208e-44 || local_518[0]._0_4_ != 4.48416e-44)
             ,NIFTITEST_FALSE,(int *)&local_764);
  do {
    iVar2 = (int)lVar7;
    iVar14 = (int)((ulong)lVar7 >> 0x20);
    (*(float (*) [4])*__s)[0] = (float)(-(uint)(iVar2 == 0 && iVar14 == 0) & 0x3f800000);
    (*(float (*) [4])*__s)[1] = (float)(-(uint)(iVar2 == 1 && iVar14 == 0) & 0x3f800000);
    (*(float (*) [4])*__s)[2] = (float)(-(uint)(iVar2 == 2 && iVar14 == 0) & 0x3f800000);
    (*(float (*) [4])*__s)[3] = (float)(-(uint)(iVar2 == 3 && iVar14 == 0) & 0x3f800000);
    lVar7 = lVar7 + 1;
    __s = __s + 1;
  } while (lVar7 != 4);
  R.m[1][1] = local_738[0].m[1][1];
  R.m[1][0] = local_738[0].m[1][0];
  R.m[2][3] = local_738[0].m[2][3];
  R.m[2][2] = local_738[0].m[2][2];
  R.m[3][3] = local_738[0].m[3][3];
  R.m[3][2] = local_738[0].m[3][2];
  R.m[0][2] = local_738[0].m[0][2];
  R.m[0][3] = local_738[0].m[0][3];
  R.m[0][0] = local_738[0].m[0][0];
  R.m[0][1] = local_738[0].m[0][1];
  R.m[1][2] = local_738[0].m[1][2];
  R.m[1][3] = local_738[0].m[1][3];
  R.m[2][0] = local_738[0].m[2][0];
  R.m[2][1] = local_738[0].m[2][1];
  R.m[3][0] = local_738[0].m[3][0];
  R.m[3][1] = local_738[0].m[3][1];
  nifti_mat44_to_quatern
            (R,(float *)local_518,(float *)&local_398,local_538,&local_73c,&local_740,&local_744,
             &local_748,&local_754,&local_758,&local_75c);
  auVar12._4_4_ = -(uint)((float)local_398.sizeof_hdr != 0.0);
  auVar12._0_4_ = -(uint)(local_518[0]._0_4_ != 0.0);
  auVar12._8_4_ = -(uint)(local_538[0] != 0.0);
  auVar12._12_4_ = -(uint)(local_73c != 0.0);
  auVar13._4_4_ = -(uint)(local_748 != 1.0);
  auVar13._0_4_ = -(uint)(local_740 != 0.0);
  auVar13._8_4_ = -(uint)(local_754 != 1.0);
  auVar13._12_4_ = -(uint)(local_758 != 1.0);
  auVar13 = packssdw(auVar12,auVar13);
  _PrintTest(0x272,"nifti_mat44_to_quatern",
             (uint)(((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  || (auVar13 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                 (auVar13 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar13 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar13 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar13 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar13 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar13 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar13 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar13 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar13 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar13 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar13 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar13 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar13[0xf] < '\0') || local_75c != 1.0),NIFTITEST_FALSE,(int *)&local_764);
  nifti_make_orthog_mat44(local_738,0.14,0.0,0.0,0.0,0.9,0.0,0.0,0.0,1.1);
  _PrintTest(0x27c,"nifti_make_orthog_mat44",
             (byte)((local_738[0].m[3][3] != 1.0 || local_738[0].m[2][2] != 1.0) |
                   -(local_738[0].m[1][1] != 1.0) | -(local_738[0].m[0][0] != 1.0)) & 1,
             NIFTITEST_FALSE,(int *)&local_764);
  nifti_swap_Nbytes(1,0x10,main::x);
  auVar11[0] = -(main::x[0] == 'A');
  auVar11[1] = -(main::x[1] == 'B');
  auVar11[2] = -(main::x[2] == 'C');
  auVar11[3] = -(main::x[3] == 'D');
  auVar11[4] = -(main::x[4] == 'E');
  auVar11[5] = -(main::x[5] == 'F');
  auVar11[6] = -(main::x[6] == 'G');
  auVar11[7] = -(main::x[7] == 'H');
  auVar11[8] = -(main::x[8] == 'h');
  auVar11[9] = -(main::x[9] == 'g');
  auVar11[10] = -(main::x[10] == 'f');
  auVar11[0xb] = -(main::x[0xb] == 'e');
  auVar11[0xc] = -(main::x[0xc] == 'd');
  auVar11[0xd] = -(main::x[0xd] == 'c');
  auVar11[0xe] = -(main::x[0xe] == 'b');
  auVar11[0xf] = -(main::x[0xf] == 'a');
  _PrintTest(0x287,"nifti_swap_16bytes",
             (uint)((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff),NIFTITEST_FALSE,
             (int *)&local_764);
  nifti_swap_Nbytes(1,8,main::x_1);
  _PrintTest(0x290,"nifti_swap_8bytes",(uint)(main::x_1 != (char  [8])0x6162636444434241),
             NIFTITEST_FALSE,(int *)&local_764);
  pnVar5 = nifti_simple_init_nim();
  _PrintTest(0x299,"nifti_simple_init_nim",(uint)(pnVar5 == (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_764);
  nifti_image_free(pnVar5);
  local_738[0].m[0]._0_8_ = (nifti_image *)0x0;
  local_518[0] = nifti_image_open("ATestReferenceImageForReadingAndWriting.hdr","r",
                                  (nifti_image **)local_738);
  _PrintTest(0x2a1,"nifti_image_open",
             (uint)(local_518[0] == (znzFile)0x0 ||
                   (nifti_image *)local_738[0].m[0]._0_8_ == (nifti_image *)0x0),NIFTITEST_FALSE,
             (int *)&local_764);
  iVar2 = nifti_image_load((nifti_image *)local_738[0].m[0]._0_8_);
  _PrintTest(0x2a4,"nifti_image_load",(uint)(iVar2 == -1),NIFTITEST_FALSE,(int *)&local_764);
  nifti_image_unload((nifti_image *)local_738[0].m[0]._0_8_);
  _PrintTest(0x2a8,"nifti_image_unload",
             (uint)(*(void **)(local_738[0].m[0]._0_8_ + 0x298) != (void *)0x0),NIFTITEST_FALSE,
             (int *)&local_764);
  Xznzclose(local_518);
  nifti_image_free((nifti_image *)local_738[0].m[0]._0_8_);
  printf("\n\nTOTAL ERRORS=%d\n",(ulong)local_764);
  return local_764;
}

Assistant:

int main (int argc, char *argv[])
{
  char TEMP_STR[256];
  nifti_set_debug_level(3);
  int Errors=0;
  {
  PrintTest("NOT REALLY AN ERROR, JUST TESTING THE ERROR TEST REPORTING MECHANISM",1,NIFTITEST_FALSE,&Errors);
  PrintTest("NOT REALLY AN ERROR, JUST TESTING THE ERROR COUNTING MECHANISM",Errors==1,NIFTITEST_FALSE,&Errors);
  Errors=0;
  }
  {
  const char write_image_filename[6][64]={
    "ATestReferenceImageForReadingAndWriting.nii",
    "ATestReferenceImageForReadingAndWriting.hdr",
    "ATestReferenceImageForReadingAndWriting.img",
    "ATestReferenceImageForReadingAndWriting.nii.gz",
    "ATestReferenceImageForReadingAndWriting.hdr.gz",
    "ATestReferenceImageForReadingAndWriting.img.gz"
  };
  printf("======= Testing All Nifti Valid Names ======\n");
  fflush(stdout);
  unsigned int filenameindex;
  for(filenameindex=0;filenameindex<6; filenameindex++)
    {
    char buf[512];
    int CompressedTwoFile = strstr(write_image_filename[filenameindex],".img.gz") != 0 ||
      strstr(write_image_filename[filenameindex],".hdr.gz") != 0;

    printf("======= Testing with filename: %s ======\n",write_image_filename[filenameindex]);
    fflush(stdout);
    nifti_image * reference_image = generate_reference_image(write_image_filename[filenameindex],&Errors);
    /*
     * Add an extension to test extension reading
     */
    {
    static char ext[] = "THIS IS A TEST";
    sprintf(buf,"nifti_add_extension %s",write_image_filename[filenameindex]);
    PrintTest(buf,
              nifti_add_extension(reference_image,
                                  ext,sizeof(ext),
                                  NIFTI_ECODE_COMMENT) == -1,
              NIFTITEST_FALSE,&Errors);
    sprintf(buf,"valid_nifti_extension %s",write_image_filename[filenameindex]);
    PrintTest("valid_nifti_extensions",
              valid_nifti_extensions(reference_image) == 0,
              NIFTITEST_FALSE,&Errors);
    }
    PrintTest("Create reference image",reference_image==0,NIFTITEST_TRUE,&Errors);
    nifti_image_write   ( reference_image ) ;
    /*
     * test nifti_copy_extension
     */
    {
      nifti_image *nim = nifti_simple_init_nim();
      PrintTest("nifti_copy_extension",
                nifti_copy_extensions(nim,reference_image),
                NIFTITEST_FALSE,&Errors);

      nifti_image_free(nim);
      nim = nifti_copy_nim_info(reference_image);
      PrintTest("nifti_copy_nim_info",
                nim == 0,
                NIFTITEST_FALSE,&Errors);
      PrintTest("nifti_nim_is_valid",
                nifti_nim_is_valid(nim,0) == 0,
                NIFTITEST_FALSE,&Errors);


      nifti_image_free(nim);

    }
    {
    nifti_image * reloaded_image = nifti_image_read(reference_image->fname,1);
    PrintTest("Reload of image ",reloaded_image==0,NIFTITEST_TRUE,&Errors);

    {
    /*
     * if the file is named '.img', '.hdr', '.img.gz', or '.hdr.gz', then
     * the header extensions won't be saved with the file.
     * The test will fail if it finds an extension in a 2-file NIfTI, or
     * fails to find one in a '.nii' or '.nii.gz' file.
     */
    int result = valid_nifti_extensions(reloaded_image);
    sprintf(buf,"reload valid_nifti_extensions %s",write_image_filename[filenameindex]);
      PrintTest(buf,
                CompressedTwoFile ? result != 0 : result == 0,
                NIFTITEST_FALSE,&Errors);
    }
    nifti_image_infodump(reloaded_image);
    compare_reference_image_values(reference_image,reloaded_image,&Errors);
    nifti_image_free(reloaded_image);
    }

    {
    nifti_brick_list   NB_orig, NB_select;

    nifti_image      * nim_orig, * nim_select;

    int                blist[5] = { 7, 0, 5, 5, 9 };

    /*
     * test some error paths in the nifti_image_read_bricks
     */
    nim_orig = nifti_image_read_bricks(reference_image->fname,0,blist, &NB_orig);
    PrintTest("invalid arg bricked image read 1",nim_orig != 0,NIFTITEST_FALSE,&Errors);

    nim_orig   = nifti_image_read_bricks(reference_image->fname, 0, NULL,  &NB_orig);
    PrintTest("Reload of bricked image",nim_orig == 0,NIFTITEST_FALSE,&Errors);
    nifti_free_NBL(&NB_orig);
    nifti_image_free(nim_orig);

    nim_select = nifti_image_read_bricks(reference_image->fname, 5, blist, &NB_select);
    PrintTest("Reload of bricked image with blist",nim_orig == 0,NIFTITEST_FALSE,&Errors);
    nifti_free_NBL(&NB_select);
    nifti_image_free(nim_select);

    }
    /*
     * test nifti_update_dims_from_array
     */
    PrintTest("nifti_update_dims_from_array -- valid dims",
              nifti_update_dims_from_array(reference_image) != 0,
              NIFTITEST_FALSE,&Errors);
    reference_image->dim[0] = 8;
    PrintTest("nifti_update_dims_from_array -- invalid dims",
              nifti_update_dims_from_array(reference_image) == 0,
              NIFTITEST_FALSE,&Errors);
    {
    nifti_1_header x = nifti_convert_nim2nhdr(reference_image);
    char buf[512];
    sprintf(buf,"nifti_hdr_looks_good %s",reference_image->fname);
    PrintTest(buf,
              !nifti_hdr_looks_good(&x),
              NIFTITEST_FALSE,&Errors);
    }

    nifti_image_free(reference_image);
    }
  /*
   * check nifti_findimgname
   */
  {
  char *imgname = nifti_findimgname("ATestReferenceImageForReadingAndWriting.hdr",2);
  PrintTest("nifti_findimgname",
            imgname == 0 ||
            strcmp(imgname,"ATestReferenceImageForReadingAndWriting.img") != 0,
            NIFTITEST_FALSE,&Errors);
  free(imgname);
  }
  {
  int IsNiftiFile;
  IsNiftiFile = is_nifti_file(write_image_filename[0]);
  PrintTest("is_nifti_file0",
            IsNiftiFile != 1,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[1]);
  PrintTest("is_nifti_file1",
            IsNiftiFile != 2,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[3]);
  PrintTest("is_nifti_file2",
            IsNiftiFile != 1,NIFTITEST_FALSE,&Errors);
  IsNiftiFile = is_nifti_file(write_image_filename[4]);
  PrintTest("is_nifti_file2",
            IsNiftiFile != 2,NIFTITEST_FALSE,&Errors);
  }

  }
  {
  /*
   * test writing and reading an ascii file
   */
  nifti_image * reference_image =
    generate_reference_image("TestAsciiImage.nia",&Errors);
  reference_image->nifti_type = 3;
  nifti_image_write(reference_image);
  nifti_image * reloaded_image = nifti_image_read("TestAsciiImage.nia",1);
  PrintTest("Read/Write Ascii image",
            reloaded_image == 0,NIFTITEST_FALSE,&Errors);
  nifti_image_free(reference_image);
  nifti_image_free(reloaded_image);
  }

  {
  enum { NUM_FILE_NAMES=8 };
  const char * FILE_NAMES[NUM_FILE_NAMES]={
    "myimage",
    "myimage.tif",
    "myimage.tif.gz",
    "myimage.nii",
    "myimage.img.gz",
    ".nii",
    ".myhiddenimage",
    ".myhiddenimage.nii"
  };
  const char * KNOWN_FILE_BASENAMES[NUM_FILE_NAMES]={
    "myimage",
    "myimage.tif",
    "myimage.tif.gz",
    "myimage",
    "myimage",
    "",
    ".myhiddenimage",
    ".myhiddenimage"
  };
  const int KNOWN_nifti_validfilename[NUM_FILE_NAMES]={
    1,
    1,
    1,
    1,
    1,
    0,
    1,
    1
  };
  const int KNOWN_nifti_is_complete_filename[NUM_FILE_NAMES]={
    0,
    0,
    0,
    1,
    1,
    0,
    0,
    1
  };
  unsigned int fni;
  for(fni=0;fni<NUM_FILE_NAMES;fni++)
    {
    printf("\nTesting \"%s\" filename\n",FILE_NAMES[fni]);
    {
    int KnownValid=nifti_validfilename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_validfilename(\"%s\")=%d",FILE_NAMES[fni],KnownValid);
    PrintTest(TEMP_STR,KnownValid != KNOWN_nifti_validfilename[fni],NIFTITEST_FALSE,&Errors);
    }
    {
    int KnownValid=nifti_is_complete_filename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_is_complete_filename(\"%s\")=%d",FILE_NAMES[fni],KnownValid);
    PrintTest(TEMP_STR,KnownValid != KNOWN_nifti_is_complete_filename[fni],NIFTITEST_FALSE,&Errors);
    }

    {
    char * basename=nifti_makebasename(FILE_NAMES[fni]);
    snprintf(TEMP_STR,256,"nifti_makebasename(\"%s\")=\"%s\"",FILE_NAMES[fni],basename);
    PrintTest(TEMP_STR,strcmp(basename,KNOWN_FILE_BASENAMES[fni]) != 0,NIFTITEST_FALSE,&Errors);
    free(basename);

    }
    }
  /*
   * the following 2 calls aren't tested, because all they do is display
   * compile-time information -- no way to fail unless writing to stdout fails.
   */
  nifti_disp_lib_hist();
  nifti_disp_lib_version();
  /*
   * the following exercises error path code in nifti_image_read_bricks
   */
  PrintTest(
            "nifti_image_read_bricks 1",
            nifti_image_read_bricks((char *)0,-1,(const int *)0,(nifti_brick_list *)0) != 0,
            NIFTITEST_FALSE,
            &Errors);
  PrintTest(
            "nifti_image_read_bricks 1",
            nifti_image_read_bricks("NOFILE.NOFILE",-1,(const int *)0,(nifti_brick_list *)0) != 0,
            NIFTITEST_FALSE,
            &Errors);
  }
  /*
   * call nifti_datatype_string with all possible values
   */
#define nifti_datatype_test(constant,string)                            \
  {                                                                     \
  char buf[64];                                                         \
  sprintf(buf,"nifti_datatype_string %s",string);                       \
  PrintTest(                                                   \
            buf,                                                        \
            strcmp(nifti_datatype_string(constant),string) != 0,        \
            NIFTITEST_FALSE,                                            \
            &Errors);                                                   \
  }
  nifti_datatype_test(DT_UNKNOWN,"UNKNOWN");
  nifti_datatype_test(DT_BINARY, "BINARY");
  nifti_datatype_test(DT_INT8, "INT8");
  nifti_datatype_test(DT_UINT8, "UINT8");
  nifti_datatype_test(DT_INT16, "INT16");
  nifti_datatype_test(DT_UINT16, "UINT16");
  nifti_datatype_test(DT_INT32, "INT32");
  nifti_datatype_test(DT_UINT32, "UINT32");
  nifti_datatype_test(DT_INT64, "INT64");
  nifti_datatype_test(DT_UINT64, "UINT64");
  nifti_datatype_test(DT_FLOAT32, "FLOAT32");
  nifti_datatype_test(DT_FLOAT64, "FLOAT64");
  nifti_datatype_test(DT_FLOAT128, "FLOAT128");
  nifti_datatype_test(DT_COMPLEX64, "COMPLEX64");
  nifti_datatype_test(DT_COMPLEX128, "COMPLEX128");
  nifti_datatype_test(DT_COMPLEX256, "COMPLEX256");
  nifti_datatype_test(DT_RGB24, "RGB24");
#define nifti_is_inttype_test(constant,rval)            \
  {                                                     \
  char buf[64];                                         \
  sprintf(buf,"nifti_datatype_string %d",constant);     \
  PrintTest(                                   \
            buf,                                        \
            nifti_is_inttype(constant) != rval,         \
            NIFTITEST_FALSE,                            \
            &Errors);                                   \
  }
  nifti_is_inttype_test(DT_UNKNOWN,0);
  nifti_is_inttype_test(DT_BINARY,0);
  nifti_is_inttype_test(DT_INT8,1);
  nifti_is_inttype_test(DT_UINT8,1);
  nifti_is_inttype_test(DT_INT16,1);
  nifti_is_inttype_test(DT_UINT16,1);
  nifti_is_inttype_test(DT_INT32,1);
  nifti_is_inttype_test(DT_UINT32,1);
  nifti_is_inttype_test(DT_INT64,1);
  nifti_is_inttype_test(DT_UINT64,1);
  nifti_is_inttype_test(DT_FLOAT32,0);
  nifti_is_inttype_test(DT_FLOAT64,0);
  nifti_is_inttype_test(DT_FLOAT128,0);
  nifti_is_inttype_test(DT_COMPLEX64,0);
  nifti_is_inttype_test(DT_COMPLEX128,0);
  nifti_is_inttype_test(DT_COMPLEX256,0);
  nifti_is_inttype_test(DT_RGB24,1);
#define nifti_units_string_test(constant,string)                \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_units_string_test %s",string);             \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_units_string(constant),string) != 0,   \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_units_string_test(NIFTI_UNITS_METER,"m");
  nifti_units_string_test(NIFTI_UNITS_MM,"mm");
  nifti_units_string_test(NIFTI_UNITS_MICRON,"um");
  nifti_units_string_test(NIFTI_UNITS_SEC,"s");
  nifti_units_string_test(NIFTI_UNITS_MSEC,"ms");
  nifti_units_string_test(NIFTI_UNITS_USEC,"us");
  nifti_units_string_test(NIFTI_UNITS_HZ,"Hz");
  nifti_units_string_test(NIFTI_UNITS_PPM,"ppm");
  nifti_units_string_test(NIFTI_UNITS_RADS,"rad/s");
#define nifti_intent_string_test(constant,string)               \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_intent_string %s",string);                 \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_intent_string(constant),string) != 0,  \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_intent_string_test(NIFTI_INTENT_CORREL,"Correlation statistic");
  nifti_intent_string_test(NIFTI_INTENT_TTEST,"T-statistic");
  nifti_intent_string_test(NIFTI_INTENT_FTEST,"F-statistic");
  nifti_intent_string_test(NIFTI_INTENT_ZSCORE,"Z-score");
  nifti_intent_string_test(NIFTI_INTENT_CHISQ,"Chi-squared distribution");
  nifti_intent_string_test(NIFTI_INTENT_BETA,"Beta distribution");
  nifti_intent_string_test(NIFTI_INTENT_BINOM,"Binomial distribution");
  nifti_intent_string_test(NIFTI_INTENT_GAMMA,"Gamma distribution");
  nifti_intent_string_test(NIFTI_INTENT_POISSON,"Poisson distribution");
  nifti_intent_string_test(NIFTI_INTENT_NORMAL,"Normal distribution");
  nifti_intent_string_test(NIFTI_INTENT_FTEST_NONC,"F-statistic noncentral");
  nifti_intent_string_test(NIFTI_INTENT_CHISQ_NONC,"Chi-squared noncentral");
  nifti_intent_string_test(NIFTI_INTENT_LOGISTIC,"Logistic distribution");
  nifti_intent_string_test(NIFTI_INTENT_LAPLACE,"Laplace distribution");
  nifti_intent_string_test(NIFTI_INTENT_UNIFORM,"Uniform distribition");
  nifti_intent_string_test(NIFTI_INTENT_TTEST_NONC,"T-statistic noncentral");
  nifti_intent_string_test(NIFTI_INTENT_WEIBULL,"Weibull distribution");
  nifti_intent_string_test(NIFTI_INTENT_CHI,"Chi distribution");
  nifti_intent_string_test(NIFTI_INTENT_INVGAUSS,"Inverse Gaussian distribution");
  nifti_intent_string_test(NIFTI_INTENT_EXTVAL,"Extreme Value distribution");
  nifti_intent_string_test(NIFTI_INTENT_PVAL,"P-value");
  nifti_intent_string_test(NIFTI_INTENT_LOGPVAL,"Log P-value");
  nifti_intent_string_test(NIFTI_INTENT_LOG10PVAL,"Log10 P-value");
  nifti_intent_string_test(NIFTI_INTENT_ESTIMATE,"Estimate");
  nifti_intent_string_test(NIFTI_INTENT_LABEL,"Label index");
  nifti_intent_string_test(NIFTI_INTENT_NEURONAME,"NeuroNames index");
  nifti_intent_string_test(NIFTI_INTENT_GENMATRIX,"General matrix");
  nifti_intent_string_test(NIFTI_INTENT_SYMMATRIX,"Symmetric matrix");
  nifti_intent_string_test(NIFTI_INTENT_DISPVECT,"Displacement vector");
  nifti_intent_string_test(NIFTI_INTENT_VECTOR,"Vector");
  nifti_intent_string_test(NIFTI_INTENT_POINTSET,"Pointset");
  nifti_intent_string_test(NIFTI_INTENT_TRIANGLE,"Triangle");
  nifti_intent_string_test(NIFTI_INTENT_QUATERNION,"Quaternion");
  nifti_intent_string_test(NIFTI_INTENT_DIMLESS,"Dimensionless number");
  nifti_intent_string_test(-200,"Unknown");

#define nifti_slice_string_test(constant,string)                \
  {                                                             \
  char buf[64];                                                 \
  sprintf(buf,"nifti_slice_string_test %s",string);             \
  PrintTest(                                           \
            buf,                                                \
            strcmp(nifti_slice_string(constant),string) != 0,   \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }
  nifti_slice_string_test(NIFTI_SLICE_SEQ_INC,"sequential_increasing");
  nifti_slice_string_test(NIFTI_SLICE_SEQ_DEC,"sequential_decreasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_INC,"alternating_increasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_DEC,"alternating_decreasing");
  nifti_slice_string_test(NIFTI_SLICE_ALT_INC2,"alternating_increasing_2");
  nifti_slice_string_test(NIFTI_SLICE_ALT_DEC2,"alternating_decreasing_2");
#define nifti_orientation_string_test(constant,string)                  \
  {                                                                     \
  char buf[64];                                                         \
  sprintf(buf,"nifti_orientation_string_test %s",string);               \
  PrintTest(                                                   \
            buf,                                                        \
            strcmp(nifti_orientation_string(constant),string) != 0,     \
            NIFTITEST_FALSE,                                            \
            &Errors);                                                   \
  }
  nifti_orientation_string_test(NIFTI_L2R,"Left-to-Right");
  nifti_orientation_string_test(NIFTI_R2L,"Right-to-Left");
  nifti_orientation_string_test(NIFTI_P2A,"Posterior-to-Anterior");
  nifti_orientation_string_test(NIFTI_A2P,"Anterior-to-Posterior");
  nifti_orientation_string_test(NIFTI_I2S,"Inferior-to-Superior");
  nifti_orientation_string_test(NIFTI_S2I,"Superior-to-Inferior");

#define nifti_datatype_sizes_test(constant,Nbyper,Swapsize)     \
  {                                                             \
  int nbyper;                                                   \
  int swapsize;                                                 \
  char buf[64];                                                 \
  sprintf(buf,"nifti_datatype_sizes_test %d",constant);         \
  nifti_datatype_sizes(constant,&nbyper,&swapsize);             \
  PrintTest(                                           \
            buf,                                                \
            nbyper != Nbyper || swapsize != Swapsize,           \
            NIFTITEST_FALSE,                                    \
            &Errors);                                           \
  }

  nifti_datatype_sizes_test(DT_UINT8,1,0);
  nifti_datatype_sizes_test(DT_UINT16,2,2);
  nifti_datatype_sizes_test(DT_RGB24,3,0);
  nifti_datatype_sizes_test(DT_FLOAT32,4,4);
  nifti_datatype_sizes_test(DT_COMPLEX64,8,4);
  nifti_datatype_sizes_test(DT_UINT64,8,8);
  nifti_datatype_sizes_test(DT_FLOAT128,16,16);
  nifti_datatype_sizes_test(DT_COMPLEX128,16,8);
  nifti_datatype_sizes_test(DT_COMPLEX256,32,16);

  {
  mat44 R;
  unsigned i,j;
  for(i = 0; i < 4; i++)
    for(j = 0; j < 4; j++)
      R.m[i][j] = (i == j ? 1 : 0);
  float qb;
  float qc;
  float qd;
  float qx;
  float qy;
  float qz;
  float dx;
  float dy;
  float dz;
  float qfac;
  nifti_mat44_to_quatern(R,&qb,&qc,&qd,&qx,&qy,&qz,&dx,&dy,&dz,&qfac);
  PrintTest("nifti_mat44_to_quatern",
            qb != 0.000000 || qc != 0.000000 || qd != 0.000000 ||
            qx != 0.000000 || qy != 0.000000 || qd != 0.000000 ||
            dx != 1.000000 || dy != 1.000000 || dz != 1.000000 ||
            qfac != 1.000000,
            NIFTITEST_FALSE,&Errors);
  }
  {
  mat44 x = nifti_make_orthog_mat44(0.14,0.0,0.0,
                                    0.0,0.9,0.0,
                                    0.0,0.0,1.1);

  PrintTest("nifti_make_orthog_mat44",
            x.m[0][0] != 1.0 || x.m[1][1] != 1.0 ||
            x.m[2][2] != 1.0 || x.m[3][3] != 1.0,
            NIFTITEST_FALSE,&Errors);
  }
  {
  static char x[16] = { 'a','b','c','d','e','f','g','h',
                        'H','G','F','E','D','C','B','A' };
  nifti_swap_Nbytes(1,16,(void *)x);
  PrintTest("nifti_swap_16bytes",
            x[0] != 'A' || x[1] != 'B' || x[2] != 'C' || x[3] != 'D' ||
            x[4] != 'E' || x[5] != 'F' || x[6] != 'G' || x[7] != 'H' ||
            x[8] != 'h' || x[9] != 'g' || x[10] != 'f' || x[11] != 'e' ||
            x[12] != 'd' || x[13] != 'c' || x[14] != 'b' || x[15] != 'a',
            NIFTITEST_FALSE,&Errors);

  }
  {
  static char x[8] = { 'a','b','c','d','D','C','B','A' };
  nifti_swap_Nbytes(1,8,(void *)x);
  PrintTest("nifti_swap_8bytes",
            x[0] != 'A' || x[1] != 'B' || x[2] != 'C' || x[3] != 'D' ||
            x[4] != 'd' || x[5] != 'c' || x[6] != 'b' || x[7] != 'a',
            NIFTITEST_FALSE,&Errors);

  }
  {
  /*
   * test nifti_simple_init_nim
   */
  nifti_image *nim = nifti_simple_init_nim();
  PrintTest("nifti_simple_init_nim",
            nim == 0,NIFTITEST_FALSE,&Errors);
  nifti_image_free(nim); nim = 0;
  /*
   * test nifti_image_open
   */
  znzFile f = nifti_image_open("ATestReferenceImageForReadingAndWriting.hdr","r",&nim);
  PrintTest("nifti_image_open",
            nim == 0 || f == 0,
            NIFTITEST_FALSE,&Errors);
  PrintTest("nifti_image_load",
            nifti_image_load(nim) == -1,
            NIFTITEST_FALSE,&Errors);
  nifti_image_unload(nim);
  PrintTest("nifti_image_unload",
            nim->data != 0,
            NIFTITEST_FALSE,&Errors);

  znzclose(f);
  nifti_image_free(nim);
  }
  /*
   * call various functions from nifti_stats
   */
  printf("\n\nTOTAL ERRORS=%d\n",Errors);
  return Errors;
}